

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O1

void __thiscall delta_complex_t::compute_oldest_cofaces(delta_complex_t *this)

{
  float fVar1;
  vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_> *pvVar2;
  pointer pdVar3;
  pointer plVar4;
  vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_> *__x;
  pointer pdVar5;
  float fVar6;
  vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_> p;
  delta_complex_cell_t q;
  vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_> local_130;
  delta_complex_cell_t local_118;
  
  __x = (this->cells).
        super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->cells).
           super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pvVar2) {
    do {
      std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::vector
                (&local_130,__x);
      pdVar3 = local_130.
               super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pdVar5 = local_130.
                    super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>.
                    _M_impl.super__Vector_impl_data._M_start; pdVar5 != pdVar3; pdVar5 = pdVar5 + 1)
      {
        delta_complex_cell_t::delta_complex_cell_t(&local_118,pdVar5);
        if (local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          fVar6 = -1.0;
          plVar4 = local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            fVar1 = *(float *)(*(long *)&(this->cells).
                                         super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start
                                         [(ulong)((long)local_118.vertices.
                                                                                                                
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                 (long)local_118.vertices.
                                                                                                              
                                                  super__Vector_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 3].
                                         super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                         ._M_impl + 0x70 + *plVar4 * 0xe8);
            if (fVar6 < fVar1) {
              fVar6 = fVar1;
              local_118.oldest_coface = *plVar4;
            }
            plVar4 = plVar4 + 1;
          } while (plVar4 != local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
        }
        std::
        _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_118.in_or_out._M_h);
        std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        ~_Rb_tree(&local_118.neighbours._M_t);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector(&local_118.orientation);
        if (local_118.vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)local_118.vertices.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.vertices.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_118.boundary.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.boundary.super__Vector_base<long,_std::allocator<long>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)local_118.boundary.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.boundary.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start != (long *)0x0) {
          operator_delete(local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.coboundary.super__Vector_base<long,_std::allocator<long>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::~vector(&local_130);
      __x = __x + 1;
    } while (__x != pvVar2);
  }
  return;
}

Assistant:

delta_complex_t read_graph(std::vector<int>& vertices, std::vector<std::vector<value_t>>& edges, const char* filter, bool dist){
	delta_complex_t complex = delta_complex_t(vertices);
	complex.add_dimension();

    print_progress(1,0);
    int prev1 = std::numeric_limits<int>::min();
    int prev2 = std::numeric_limits<int>::min();
    for (auto i : edges){
 		value_t val = 0;
		if(i.size() == 3) val = i[2];
        if(i[0] <= prev1 && i[1] <= prev2){
            std::cout << "Error: edges are not in lexicographic order or added same edge twice." << std::endl;
            exit(-1);
        }
		complex.add_edge(i[0],i[1],val);
        prev1 = i[0];
        prev2 = i[1];
    }
    build_count_and_filter(complex, filter, dist);

    return complex;
}